

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

double __thiscall soplex::SPxLPBase<double>::objUnscaled(SPxLPBase<double> *this,int i)

{
  double extraout_XMM0_Qa;
  double dVar1;
  
  if (this->_isScaled == true) {
    (*this->lp_scaler->_vptr_SPxScaler[0x18])(this->lp_scaler,this);
    dVar1 = extraout_XMM0_Qa;
  }
  else {
    dVar1 = (this->super_LPColSetBase<double>).object.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i];
  }
  if (this->thesense == MINIMIZE) {
    dVar1 = -dVar1;
  }
  return dVar1;
}

Assistant:

R SPxLPBase<R>::objUnscaled(int i) const
{
   assert(i >= 0 && i < nCols());
   R res;

   if(_isScaled)
   {
      res = lp_scaler->maxObjUnscaled(*this, i);
   }
   else
   {
      res = maxObj(i);
   }

   if(spxSense() == MINIMIZE)
      res *= -1;

   return res;
}